

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_get_attribute_by_name
          (exr_const_context_t ctxt,int part_index,char *name,exr_attribute_t **outattr)

{
  exr_result_t eVar1;
  exr_attribute_t *tmpptr;
  exr_attribute_t *local_10;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar1;
    }
    if (outattr == (exr_attribute_t **)0x0) {
      eVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
      return eVar1;
    }
    eVar1 = exr_attr_list_find_by_name
                      (ctxt,(exr_attribute_list_t *)
                            (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8),
                       name,&local_10);
    if (eVar1 == 0) {
      *outattr = local_10;
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_get_attribute_by_name (
    exr_const_context_t     ctxt,
    int                     part_index,
    const char*             name,
    const exr_attribute_t** outattr)
{
    exr_attribute_t* tmpptr;
    exr_result_t     rv;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!outattr)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    rv = exr_attr_list_find_by_name (
        EXR_CONST_CAST (exr_context_t, ctxt),
        EXR_CONST_CAST (exr_attribute_list_t*, &(part->attributes)),
        name,
        &tmpptr);
    if (rv == EXR_ERR_SUCCESS) *outattr = tmpptr;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}